

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * multiSelectCollSeq(Parse *pParse,Select *p,int iCol)

{
  CollSeq *pCVar1;
  int in_EDX;
  Parse *in_RSI;
  CollSeq *pRet;
  undefined4 in_stack_00000010;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_RSI->aLabel == (int *)0x0) {
    pCVar1 = (CollSeq *)0x0;
  }
  else {
    pCVar1 = multiSelectCollSeq(in_RSI,(Select *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                                (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  }
  if ((pCVar1 == (CollSeq *)0x0) && (in_EDX < *(int *)&in_RSI->db->pVfs)) {
    pCVar1 = sqlite3ExprCollSeq((Parse *)CONCAT44(iCol,in_stack_00000010),(Expr *)pRet);
  }
  return pCVar1;
}

Assistant:

static CollSeq *multiSelectCollSeq(Parse *pParse, Select *p, int iCol){
  CollSeq *pRet;
  if( p->pPrior ){
    pRet = multiSelectCollSeq(pParse, p->pPrior, iCol);
  }else{
    pRet = 0;
  }
  assert( iCol>=0 );
  /* iCol must be less than p->pEList->nExpr.  Otherwise an error would
  ** have been thrown during name resolution and we would not have gotten
  ** this far */
  if( pRet==0 && ALWAYS(iCol<p->pEList->nExpr) ){
    pRet = sqlite3ExprCollSeq(pParse, p->pEList->a[iCol].pExpr);
  }
  return pRet;
}